

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

int __thiscall
SatPos::CalculateClkDif(SatPos *this,Ephemeris *Eph,int prn,SATTIME tsv,NavSys sys,double *ClkDif)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  SATTIME t_now;
  double deltatr;
  double Ek;
  double F;
  double *ClkDif_local;
  NavSys sys_local;
  int prn_local;
  Ephemeris *Eph_local;
  SatPos *this_local;
  SATTIME tsv_local;
  
  dVar2 = tsv.SOW;
  *ClkDif = 0.0;
  if (sys == GPS) {
    dVar3 = sqrt(398600500000000.0);
    Ek = ((dVar3 * -2.0) / 299792458.0) / 299792458.0;
    deltatr = this->Gps[prn].Ek;
  }
  else if (sys == BDS) {
    dVar3 = sqrt(398600441800000.0);
    Ek = ((dVar3 * -2.0) / 299792458.0) / 299792458.0;
    deltatr = this->Bds[prn].Ek;
  }
  dVar3 = Eph[prn].ecc;
  dVar1 = Eph[prn].sqrtA;
  dVar4 = sin(deltatr);
  *ClkDif = Eph[prn].af2 * (dVar2 - Eph[prn].toc) * (dVar2 - Eph[prn].toc) +
            Eph[prn].af1 * (dVar2 - Eph[prn].toc) + Eph[prn].af0 + Ek * dVar3 * dVar1 * dVar4;
  return 0;
}

Assistant:

int SatPos::CalculateClkDif(const Ephemeris* Eph, const int prn, const SATTIME tsv,
                            const NavSys sys, double &ClkDif)
{
    double F, Ek;
    ClkDif = 0;
    try
    {
        if(sys == GPS){
            F = -2 * sqrt(GPSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Gps[prn].Ek;
        }
        else if(sys == BDS){
            F = -2 * sqrt(BDSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Bds[prn].Ek;
        }
    }
    catch(...)
    {
        cout << "error happened when calculation satellite clock difference" << endl;
        return UNKNOWN_ERROR;
    }
    
    double deltatr = F * Eph[prn].ecc * Eph[prn].sqrtA * sin(Ek);
    SATTIME t_now = tsv;
    ClkDif = Eph[prn].af0 + Eph[prn].af1 * (t_now.SOW - Eph[prn].toc) + Eph[prn].af2 * (t_now.SOW - Eph[prn].toc) * (t_now.SOW - Eph[prn].toc)+ deltatr; // 双频观测  不加TGD

    return 0;
}